

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteTag(WatWriter *this,Tag *tag)

{
  NextChar in_R8D;
  string_view str;
  
  WriteOpenSpace(this,"tag");
  str._M_str = (tag->name)._M_dataplus._M_p;
  str._M_len = (tag->name)._M_string_length;
  WriteNameOrIndex(this,str,this->tag_index_,in_R8D);
  WriteInlineExports(this,Last,this->tag_index_);
  WriteInlineImport(this,Last,this->tag_index_);
  if ((tag->decl).has_func_type == true) {
    WriteOpenSpace(this,"type");
    WriteVar(this,&(tag->decl).type_var,None);
    WriteCloseSpace(this);
  }
  WriteTypes(this,&(tag->decl).sig.param_types,"param");
  this->tag_index_ = this->tag_index_ + 1;
  WriteCloseNewline(this);
  return;
}

Assistant:

void WatWriter::WriteTag(const Tag& tag) {
  WriteOpenSpace("tag");
  WriteNameOrIndex(tag.name, tag_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Tag, tag_index_);
  WriteInlineImport(ExternalKind::Tag, tag_index_);
  if (tag.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(tag.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }
  WriteTypes(tag.decl.sig.param_types, "param");
  ++tag_index_;
  WriteCloseNewline();
}